

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue_get.cpp
# Opt level: O1

double __thiscall UniValue::get_real(UniValue *this)

{
  string *str;
  char *pcVar1;
  bool bVar2;
  runtime_error *this_00;
  istringstream text;
  double local_1a8;
  double local_1a0;
  locale local_198 [8];
  double local_190 [4];
  uint auStack_170 [22];
  ios_base local_118 [264];
  
  if (this->typ == VNUM) {
    str = &this->val;
    bVar2 = anon_unknown.dwarf_121132f::ParsePrechecks(str);
    if ((bVar2) &&
       ((((this->val)._M_string_length < 2 || (pcVar1 = (str->_M_dataplus)._M_p, *pcVar1 != '0')) ||
        (pcVar1[1] != 'x')))) {
      std::__cxx11::istringstream::istringstream((istringstream *)local_190,(string *)str,_S_in);
      std::locale::classic();
      std::ios::imbue(local_198);
      std::locale::~locale(local_198);
      std::istream::_M_extract<double>(local_190);
      local_1a8 = local_1a0;
      bVar2 = (*(uint *)((long)auStack_170 + *(long *)((long)local_190[0] + -0x18)) & 7) == 2;
      std::__cxx11::istringstream::~istringstream((istringstream *)local_190);
      std::ios_base::~ios_base(local_118);
    }
    else {
      bVar2 = false;
    }
    if (bVar2) {
      return local_1a8;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"JSON double out of range");
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"JSON value is not a number as expected");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

double UniValue::get_real() const
{
    if (typ != VNUM)
        throw std::runtime_error("JSON value is not a number as expected");
    double retval;
    if (!ParseDouble(getValStr(), &retval))
        throw std::runtime_error("JSON double out of range");
    return retval;
}